

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O2

bool fs_is_reserved(string_view path)

{
  _Bool _Var1;
  bool bVar2;
  int iVar3;
  long lVar4;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  size_type sVar6;
  string_view path_00;
  string n;
  string s;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_30UL> r;
  string local_238;
  string local_218;
  undefined1 local_1f8 [480];
  
  _Var1 = fs_is_windows();
  if (_Var1) {
    fs_file_name_abi_cxx11_(&local_238,path);
    if ((local_238._M_string_length == 0) || (bVar2 = std::operator==(&local_238,"."), bVar2)) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if (((local_238._M_dataplus._M_p[local_238._M_string_length - 1] != ' ') &&
          (local_238._M_dataplus._M_p[local_238._M_string_length - 1] != '.')) &&
         (lVar4 = std::__cxx11::string::find_first_of((char *)&local_238,0x123204), lVar4 == -1)) {
        path_00._M_str = local_238._M_dataplus._M_p;
        path_00._M_len = local_238._M_string_length;
        fs_stem_abi_cxx11_(&local_218,path_00);
        if (local_218._M_string_length - 3 < 2) {
          for (sVar6 = 0; local_218._M_string_length != sVar6; sVar6 = sVar6 + 1) {
            iVar3 = toupper((int)local_218._M_dataplus._M_p[sVar6]);
            local_218._M_dataplus._M_p[sVar6] = (char)iVar3;
          }
          memcpy(local_1f8,&DAT_0012cb88,0x1e0);
          pbVar5 = std::
                   __find_if<std::basic_string_view<char,std::char_traits<char>>const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (local_1f8,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              &stack0xffffffffffffffe8,&local_218);
          bVar2 = pbVar5 != (basic_string_view<char,_std::char_traits<char>_> *)
                            &stack0xffffffffffffffe8;
        }
        else {
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&local_218);
      }
    }
    std::__cxx11::string::~string((string *)&local_238);
    return bVar2;
  }
  return false;
}

Assistant:

bool
fs_is_reserved(std::string_view path)
{
  // defined as https://docs.python.org/3.13/library/os.path.html#os.path.isreserved
  if(!fs_is_windows())
    return false;

  std::string const n = fs_file_name(path);

  if(n.empty() || n == ".")
    return false;

  if(n.back() == '.' || n.back() == ' ')
    return true;

  // return true if filename contains any of :*?"<>| or ends with a space or period
  // https://docs.microsoft.com/en-us/windows/win32/fileio/naming-a-file

  if(n.find_first_of(R"(<>:"/\|?*)") != std::string::npos)
    return true;

  // don't detect ASCII control characters as reserved, since multi-byte characters may falsely trip that check

  std::string s = fs_stem(n);

  if(std::string::size_type L = s.length();
      L < 3 || L > 4)
    return false;

  // convert to upper case
  std::transform(s.begin(), s.end(), s.begin(), ::toupper);

// check if the stem is a reserved device name
  constexpr std::array<std::string_view, 30> r = {"CON", "PRN", "AUX", "NUL",
    "COM1", "COM2", "COM3", "COM4", "COM5", "COM6", "COM7", "COM8", "COM9", "COM¹", "COM²", "COM³",
    "LPT1", "LPT2", "LPT3", "LPT4", "LPT5", "LPT6", "LPT7", "LPT8", "LPT9", "LPT¹", "LPT²", "LPT³",
    "CONIN$", "CONOUT$"};

#ifdef __cpp_lib_ranges_contains  // C++23
  if (std::ranges::contains(r, s))
#elif defined(__cpp_lib_ranges) // C++20
  if (std::ranges::find(r, s) != r.end())
#else // C++98
  if (std::find(r.begin(), r.end(), s) != r.end())
#endif
    return true;

return false;
}